

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_move.cpp
# Opt level: O2

void __thiscall DBot::TurnToAng(DBot *this)

{
  AWeapon *pAVar1;
  APlayerPawn *pAVar2;
  bool bVar3;
  AActor *pAVar4;
  double dVar5;
  double local_38;
  DAngle local_18;
  
  pAVar1 = this->player->ReadyWeapon;
  local_38 = 15.0;
  if (pAVar1 != (AWeapon *)0x0) {
    if (((((pAVar1->super_AInventory).field_0x4df & 0x40) != 0) && (this->t_roam != 0)) &&
       (pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->missile), pAVar4 == (AActor *)0x0)) {
      return;
    }
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->enemy);
    if (((pAVar4 != (AActor *)0x0) &&
        (pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->dest), pAVar4 == (AActor *)0x0)) &&
       ((pAVar1 = this->player->ReadyWeapon, pAVar1->ProjectileType == (PClassActor *)0x0 &&
        (((pAVar1->super_AInventory).field_0x4dd & 0x80) == 0)))) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->enemy);
      local_18.Degrees = 65.0;
      bVar3 = Check_LOS(this,pAVar4,&local_18);
      if (bVar3) {
        local_38 = 3.0;
      }
    }
  }
  dVar5 = (double)SUB84(((this->Angle).Degrees - (this->player->mo->super_AActor).Angles.Yaw.Degrees
                        ) * 11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
  if ((ABS(dVar5) < 5.0) &&
     (pAVar4 = GC::ReadBarrier<AActor>((AActor **)&this->enemy), pAVar4 == (AActor *)0x0)) {
    return;
  }
  dVar5 = dVar5 / 3.0;
  if (local_38 < ABS(dVar5)) {
    dVar5 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)local_38 |
                    (ulong)-local_38 & -(ulong)(dVar5 < 0.0));
  }
  pAVar2 = this->player->mo;
  (pAVar2->super_AActor).Angles.Yaw.Degrees = dVar5 + (pAVar2->super_AActor).Angles.Yaw.Degrees;
  return;
}

Assistant:

void DBot::TurnToAng ()
{
    double maxturn = MAXTURN;

	if (player->ReadyWeapon != NULL)
	{
		if (player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE)
		{
			if (t_roam && !missile)
			{ //Keep angle that where when shot where decided.
				return;
			}
		}


		if(enemy)
			if(!dest) //happens when running after item in combat situations, or normal, prevents weak turns
				if(player->ReadyWeapon->ProjectileType == NULL && !(player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON))
					if(Check_LOS(enemy, SHOOTFOV+5))
						maxturn = 3;
	}

	DAngle distance = deltaangle(player->mo->Angles.Yaw, Angle);

	if (fabs (distance) < OKAYRANGE && !enemy)
		return;

	distance /= TURNSENS;
	if (fabs (distance) > maxturn)
		distance = distance < 0 ? -maxturn : maxturn;

	player->mo->Angles.Yaw += distance;
}